

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_rotc_rm_T1(DisasContext *s,MemOp ot,int op1,int is_right)

{
  TCGContext *tcg_ctx_00;
  TCGContext *tcg_ctx;
  int is_right_local;
  int op1_local;
  MemOp ot_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  gen_compute_eflags(s);
  if (op1 == 0x10) {
    gen_op_ld_v(s,ot,s->T0,s->A0);
  }
  else {
    gen_op_mov_v_reg(s,ot,s->T0,op1);
  }
  if (is_right == 0) {
    switch(ot) {
    case MO_8:
      gen_helper_rclb(tcg_ctx_00,s->T0,tcg_ctx_00->cpu_env,s->T0,s->T1);
      break;
    case MO_16:
      gen_helper_rclw(tcg_ctx_00,s->T0,tcg_ctx_00->cpu_env,s->T0,s->T1);
      break;
    case MO_32:
      gen_helper_rcll(tcg_ctx_00,s->T0,tcg_ctx_00->cpu_env,s->T0,s->T1);
      break;
    case MO_64:
      gen_helper_rclq(tcg_ctx_00,s->T0,tcg_ctx_00->cpu_env,s->T0,s->T1);
      break;
    default:
      fprintf(_stderr,"%s:%d: tcg fatal error\n",
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/translate.c"
              ,0x7cd);
      abort();
    }
  }
  else {
    switch(ot) {
    case MO_8:
      gen_helper_rcrb(tcg_ctx_00,s->T0,tcg_ctx_00->cpu_env,s->T0,s->T1);
      break;
    case MO_16:
      gen_helper_rcrw(tcg_ctx_00,s->T0,tcg_ctx_00->cpu_env,s->T0,s->T1);
      break;
    case MO_32:
      gen_helper_rcrl(tcg_ctx_00,s->T0,tcg_ctx_00->cpu_env,s->T0,s->T1);
      break;
    case MO_64:
      gen_helper_rcrq(tcg_ctx_00,s->T0,tcg_ctx_00->cpu_env,s->T0,s->T1);
      break;
    default:
      fprintf(_stderr,"%s:%d: tcg fatal error\n",
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/translate.c"
              ,0x7ba);
      abort();
    }
  }
  gen_op_st_rm_T0_A0(s,ot,op1);
  return;
}

Assistant:

static void gen_rotc_rm_T1(DisasContext *s, MemOp ot, int op1,
                           int is_right)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    gen_compute_eflags(s);
    // assert(s->cc_op == CC_OP_EFLAGS);

    /* load */
    if (op1 == OR_TMP0)
        gen_op_ld_v(s, ot, s->T0, s->A0);
    else
        gen_op_mov_v_reg(s, ot, s->T0, op1);
    
    if (is_right) {
        switch (ot) {
        case MO_8:
            gen_helper_rcrb(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
        case MO_16:
            gen_helper_rcrw(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
        case MO_32:
            gen_helper_rcrl(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
#ifdef TARGET_X86_64
        case MO_64:
            gen_helper_rcrq(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
#endif
        default:
            tcg_abort();
        }
    } else {
        switch (ot) {
        case MO_8:
            gen_helper_rclb(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
        case MO_16:
            gen_helper_rclw(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
        case MO_32:
            gen_helper_rcll(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
#ifdef TARGET_X86_64
        case MO_64:
            gen_helper_rclq(tcg_ctx, s->T0, tcg_ctx->cpu_env, s->T0, s->T1);
            break;
#endif
        default:
            tcg_abort();
        }
    }
    /* store */
    gen_op_st_rm_T0_A0(s, ot, op1);
}